

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::Print
          (ForwardDeclarations *this,Printer *printer,Options *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations_*>_>_>
  *pmVar1;
  Options *options_00;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  allocator local_69;
  ForwardDeclarations *local_68;
  Options *local_60;
  _Rb_tree_node_base *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = this;
  local_60 = options;
  for (p_Var2 = (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->enums_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    io::Printer::Print(printer,"enum $enumname$ : int;\n","enumname",(string *)(p_Var2 + 1));
    io::Printer::Annotate<google::protobuf::EnumDescriptor>
              (printer,"enumname",*(EnumDescriptor **)(p_Var2 + 2));
    io::Printer::Print(printer,"bool $enumname$_IsValid(int value);\n","enumname",
                       (string *)(p_Var2 + 1));
  }
  local_58 = &(local_68->classes_)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var3 = (local_68->classes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      options_00 = local_60, p_Var3 != local_58;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    io::Printer::Print(printer,"class $classname$;\n","classname",(string *)(p_Var3 + 1));
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",*(Descriptor **)(p_Var3 + 2));
    if ((options_00->dllexport_decl)._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_50,"",&local_69);
    }
    else {
      std::operator+(&local_50,&options_00->dllexport_decl," ");
    }
    io::Printer::Print(printer,
                       "class $classname$DefaultTypeInternal;\n$dllexport_decl$extern $classname$DefaultTypeInternal _$classname$_default_instance_;\n"
                       ,"dllexport_decl",&local_50,"classname",(string *)(p_Var3 + 1));
    std::__cxx11::string::~string((string *)&local_50);
  }
  pmVar1 = &local_68->namespaces_;
  for (p_Var2 = (local_68->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    io::Printer::Print(printer,"namespace $nsname$ {\n","nsname",(string *)(p_Var2 + 1));
    Print(*(ForwardDeclarations **)(p_Var2 + 2),printer,options_00);
    io::Printer::Print(printer,"}  // namespace $nsname$\n","nsname",(string *)(p_Var2 + 1));
  }
  return;
}

Assistant:

void Print(io::Printer* printer, const Options& options) const {
    for (std::map<string, const EnumDescriptor *>::const_iterator
             it = enums_.begin(),
             end = enums_.end();
         it != end; ++it) {
      printer->Print("enum $enumname$ : int;\n", "enumname", it->first);
      printer->Annotate("enumname", it->second);
      printer->Print("bool $enumname$_IsValid(int value);\n", "enumname",
                     it->first);
    }
    for (std::map<string, const Descriptor*>::const_iterator
             it = classes_.begin(),
             end = classes_.end();
         it != end; ++it) {
      printer->Print("class $classname$;\n", "classname", it->first);
      printer->Annotate("classname", it->second);

      printer->Print(
          "class $classname$DefaultTypeInternal;\n"
          "$dllexport_decl$"
          "extern $classname$DefaultTypeInternal "
          "_$classname$_default_instance_;\n",  // NOLINT
          "dllexport_decl",
          options.dllexport_decl.empty() ? "" : options.dllexport_decl + " ",
          "classname",
          it->first);
    }
    for (std::map<string, ForwardDeclarations *>::const_iterator
             it = namespaces_.begin(),
             end = namespaces_.end();
         it != end; ++it) {
      printer->Print("namespace $nsname$ {\n",
                     "nsname", it->first);
      it->second->Print(printer, options);
      printer->Print("}  // namespace $nsname$\n",
                     "nsname", it->first);
    }
  }